

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O0

void ssl_tls_trace(int direction,int ssl_ver,int content_type,void *buf,size_t len,SSL *ssl,
                  void *userp)

{
  char *pcVar1;
  uint uVar2;
  curl_infotype type;
  int local_47c;
  int txt_len;
  int msg_type;
  char ssl_buf [1024];
  char *tls_rt_name;
  char *msg_name;
  connectdata *conn;
  char *verstr;
  char unknown [32];
  Curl_easy *data;
  SSL *ssl_local;
  size_t len_local;
  void *buf_local;
  int content_type_local;
  int ssl_ver_local;
  int direction_local;
  
  conn = (connectdata *)0x0;
  if ((((userp != (void *)0x0) && (*userp != 0)) && (*(long *)(*userp + 0x718) != 0)) &&
     ((direction == 0 || (direction == 1)))) {
    unknown._24_8_ = *userp;
    if (ssl_ver != 0) {
      if (ssl_ver == 2) {
        conn = (connectdata *)anon_var_dwarf_f78e0;
      }
      else if (ssl_ver == 0x300) {
        conn = (connectdata *)anon_var_dwarf_f78f7;
      }
      else if (ssl_ver == 0x301) {
        conn = (connectdata *)anon_var_dwarf_f7902;
      }
      else if (ssl_ver == 0x302) {
        conn = (connectdata *)anon_var_dwarf_f790d;
      }
      else if (ssl_ver == 0x303) {
        conn = (connectdata *)anon_var_dwarf_f7918;
      }
      else if (ssl_ver == 0x304) {
        conn = (connectdata *)anon_var_dwarf_f7923;
      }
      else {
        curl_msnprintf((char *)&verstr,0x20,"(%x)",(ulong)(uint)ssl_ver);
        conn = (connectdata *)&verstr;
      }
    }
    if ((ssl_ver != 0) && (content_type != 0x101)) {
      if ((ssl_ver >> 8 == 3) && (content_type != 0)) {
        ssl_buf._1016_8_ = tls_rt_type(content_type);
      }
      else {
        ssl_buf._1016_8_ = (long)"n,a=%s,\x01host=%s\x01port=%ld\x01auth=Bearer %s\x01\x01" + 0x29;
      }
      if (content_type == 0x14) {
        local_47c = (int)*buf;
        tls_rt_name = "Change cipher spec";
      }
      else if (content_type == 0x15) {
        local_47c = *buf * 0x100 + (int)*(char *)((long)buf + 1);
        tls_rt_name = SSL_alert_desc_string_long(local_47c);
      }
      else {
        local_47c = (int)*buf;
        tls_rt_name = ssl_msg_type(ssl_ver >> 8,local_47c);
      }
      pcVar1 = "PLAIN";
      if (direction != 0) {
        pcVar1 = "LOGOUT";
      }
      uVar2 = curl_msnprintf((char *)&txt_len,0x400,"%s (%s), %s, %s (%d):\n",conn,pcVar1 + 3,
                             ssl_buf._1016_8_,tls_rt_name,local_47c);
      if ((-1 < (int)uVar2) && (uVar2 < 0x400)) {
        Curl_debug((Curl_easy *)unknown._24_8_,CURLINFO_TEXT,(char *)&txt_len,(long)(int)uVar2);
      }
    }
    type = CURLINFO_SSL_DATA_IN;
    if (direction == 1) {
      type = CURLINFO_SSL_DATA_OUT;
    }
    Curl_debug((Curl_easy *)unknown._24_8_,type,(char *)buf,len);
  }
  return;
}

Assistant:

static void ssl_tls_trace(int direction, int ssl_ver, int content_type,
                          const void *buf, size_t len, SSL *ssl,
                          void *userp)
{
  struct Curl_easy *data;
  char unknown[32];
  const char *verstr = NULL;
  struct connectdata *conn = userp;

  if(!conn || !conn->data || !conn->data->set.fdebug ||
     (direction != 0 && direction != 1))
    return;

  data = conn->data;

  switch(ssl_ver) {
#ifdef SSL2_VERSION /* removed in recent versions */
  case SSL2_VERSION:
    verstr = "SSLv2";
    break;
#endif
#ifdef SSL3_VERSION
  case SSL3_VERSION:
    verstr = "SSLv3";
    break;
#endif
  case TLS1_VERSION:
    verstr = "TLSv1.0";
    break;
#ifdef TLS1_1_VERSION
  case TLS1_1_VERSION:
    verstr = "TLSv1.1";
    break;
#endif
#ifdef TLS1_2_VERSION
  case TLS1_2_VERSION:
    verstr = "TLSv1.2";
    break;
#endif
#ifdef TLS1_3_VERSION
  case TLS1_3_VERSION:
    verstr = "TLSv1.3";
    break;
#endif
  case 0:
    break;
  default:
    msnprintf(unknown, sizeof(unknown), "(%x)", ssl_ver);
    verstr = unknown;
    break;
  }

  /* Log progress for interesting records only (like Handshake or Alert), skip
   * all raw record headers (content_type == SSL3_RT_HEADER or ssl_ver == 0).
   * For TLS 1.3, skip notification of the decrypted inner Content Type.
   */
  if(ssl_ver
#ifdef SSL3_RT_INNER_CONTENT_TYPE
     && content_type != SSL3_RT_INNER_CONTENT_TYPE
#endif
    ) {
    const char *msg_name, *tls_rt_name;
    char ssl_buf[1024];
    int msg_type, txt_len;

    /* the info given when the version is zero is not that useful for us */

    ssl_ver >>= 8; /* check the upper 8 bits only below */

    /* SSLv2 doesn't seem to have TLS record-type headers, so OpenSSL
     * always pass-up content-type as 0. But the interesting message-type
     * is at 'buf[0]'.
     */
    if(ssl_ver == SSL3_VERSION_MAJOR && content_type)
      tls_rt_name = tls_rt_type(content_type);
    else
      tls_rt_name = "";

    if(content_type == SSL3_RT_CHANGE_CIPHER_SPEC) {
      msg_type = *(char *)buf;
      msg_name = "Change cipher spec";
    }
    else if(content_type == SSL3_RT_ALERT) {
      msg_type = (((char *)buf)[0] << 8) + ((char *)buf)[1];
      msg_name = SSL_alert_desc_string_long(msg_type);
    }
    else {
      msg_type = *(char *)buf;
      msg_name = ssl_msg_type(ssl_ver, msg_type);
    }

    txt_len = msnprintf(ssl_buf, sizeof(ssl_buf), "%s (%s), %s, %s (%d):\n",
                        verstr, direction?"OUT":"IN",
                        tls_rt_name, msg_name, msg_type);
    if(0 <= txt_len && (unsigned)txt_len < sizeof(ssl_buf)) {
      Curl_debug(data, CURLINFO_TEXT, ssl_buf, (size_t)txt_len);
    }
  }

  Curl_debug(data, (direction == 1) ? CURLINFO_SSL_DATA_OUT :
             CURLINFO_SSL_DATA_IN, (char *)buf, len);
  (void) ssl;
}